

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double fisher_pdf(double *x,double kappa,double *mu)

{
  int i;
  long lVar1;
  ostream *poVar2;
  double value;
  double dVar3;
  double dVar4;
  double dVar5;
  double adVar6 [1];
  double adVar7 [1];
  double local_38;
  double b [1];
  
  if (0.0 <= kappa) {
    if ((kappa != 0.0) || (NAN(kappa))) {
      ribesl(kappa,0.5,1,1,&local_38);
      if (kappa < 0.0) {
        dVar5 = sqrt(kappa);
      }
      else {
        dVar5 = SQRT(kappa);
      }
      dVar3 = 0.0;
      lVar1 = 0;
      do {
        dVar3 = dVar3 + mu[lVar1] * mu[lVar1];
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
      if (dVar3 < 0.0) {
        b[0] = local_38 * 15.749609945722419;
        adVar6[0] = sqrt(dVar3);
        adVar7[0] = b[0];
      }
      else {
        adVar6[0] = SQRT(dVar3);
        adVar7[0] = local_38 * 15.749609945722419;
      }
      dVar3 = 0.0;
      dVar5 = dVar5 / adVar7[0];
      if ((adVar6[0] != 0.0) || (NAN(adVar6[0]))) {
        lVar1 = 0;
        do {
          dVar3 = dVar3 + x[lVar1] * x[lVar1];
          lVar1 = lVar1 + 1;
        } while (lVar1 != 3);
        if (dVar3 < 0.0) {
          b[0] = adVar6[0];
          dVar3 = sqrt(dVar3);
          adVar6[0] = b[0];
        }
        else {
          dVar3 = SQRT(dVar3);
        }
        dVar4 = 0.0;
        if ((dVar3 != 0.0) || (NAN(dVar3))) {
          lVar1 = 0;
          do {
            dVar4 = dVar4 + x[lVar1] * mu[lVar1];
            lVar1 = lVar1 + 1;
          } while (lVar1 != 3);
          dVar3 = exp((dVar4 * kappa) / (adVar6[0] * dVar3));
          dVar5 = dVar5 * dVar3;
        }
      }
    }
    else {
      dVar5 = 0.07957747154594767;
    }
    return dVar5;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"FISHER_PDF - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  KAPPA must be nonnegative.\n");
  poVar2 = std::operator<<((ostream *)&std::cerr,"  Input KAPPA = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,kappa);
  std::operator<<(poVar2,"\n");
  exit(1);
}

Assistant:

double fisher_pdf ( double x[3], double kappa, double mu[3] )

//****************************************************************************80
//
//  Purpose:
//
//    FISHER_PDF evaluates the Fisher PDF.
//
//  Discussion:
//
//    The formula for the PDF is:
//
//      PDF(KAPPA,MU;X) = C(KAPPA) * exp ( KAPPA * MU' * X )
//
//    where:
//
//      0 <= KAPPA is the concentration parameter,
//      MU is a point on the unit sphere, the mean direction,
//      X is any point on the unit sphere,
//      and C(KAPPA) is a normalization factor:
//
//      C(KAPPA) = sqrt ( KAPPA ) / ( ( 2 * pi )^(3/2) * I(0.5,KAPPA) )
//
//    where
//
//      I(nu,X) is the Bessel function of order NU and argument X.
//
//    For a fixed value of MU, the value of KAPPA determines the
//    tendency of sample points to tend to be near MU.  In particular,
//    KAPPA = 0 corresponds to a uniform distribution of points on the
//    sphere, but as KAPPA increases, the sample points will tend to
//    cluster more closely to MU.
//
//    The Fisher distribution for points on the unit sphere is
//    analogous to the normal distribution of points on a line,
//    and, more precisely, to the von Mises distribution on a circle.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    01 March 2007
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Kanti Mardia, Peter Jupp,
//    Directional Statistics,
//    Wiley, 2000,
//    LC: QA276.M335
//
//  Parameters:
//
//    Input, double X[3], the argument of the PDF.
//    X should have unit Euclidean norm, but this routine will
//    automatically work with a normalized version of X.
//
//    Input, double KAPPA, the concentration parameter.
//    0 <= KAPPA is required.
//
//    Input, double MU[3], the mean direction.
//    MU should have unit Euclidean norm, but this routine will
//    automatically work with a normalized version of MU.
//
//    Output, double FISHER_PDF, the value of the PDF.
//
{
# define NB 1

  double alpha;
  double arg;
  double b[NB];
  double cf;
  int ize;
  double mu_norm;
  double pdf;
  const double r8_pi = 3.141592653589793;
  double x_norm;

  if ( kappa < 0.0 )
  {
    cerr << "\n";
    cerr << "FISHER_PDF - Fatal error!\n";
    cerr << "  KAPPA must be nonnegative.\n";
    cerr << "  Input KAPPA = " << kappa << "\n";
    exit ( 1 );
  }

  if ( kappa == 0.0 )
  {
    pdf = 1.0 / ( 4.0 * r8_pi );
    return pdf;
  }

  alpha = 0.5;
  ize = 1;

  ribesl ( kappa, alpha, NB, ize, b );

  cf = sqrt ( kappa ) / ( sqrt ( pow ( 2.0 * r8_pi, 3 ) ) * b[0] );

  mu_norm = r8vec_length ( 3, mu );

  if ( mu_norm == 0.0 )
  {
    pdf = cf;
    return pdf;
  }

  x_norm = r8vec_length ( 3, x );

  if ( x_norm == 0.0 )
  {
    pdf = cf;
    return pdf;
  }

  arg = kappa * r8vec_dot ( 3, x, mu ) / ( x_norm * mu_norm );

  pdf = cf * exp ( arg );

  return pdf;
# undef NB
}